

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Iterator<int,true,std::allocator<unsigned_long>>::
coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Iterator<int,true,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          it)

{
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  long lVar1;
  runtime_error *this_01;
  long lVar2;
  long lVar3;
  
  this_00 = *(View<int,_true,_std::allocator<unsigned_long>_> **)this;
  if (this_00 == (View<int,_true,_std::allocator<unsigned_long>_> *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
  }
  else {
    if (*(ulong *)(this + 0x10) < (this_00->geometry_).size_) {
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
      if ((this_00->geometry_).isSimple_ != false) {
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  (*(View<int,true,std::allocator<unsigned_long>> **)this,*(size_t *)(this + 0x10),
                   it);
        return;
      }
      lVar1 = *(long *)(this + 0x18);
      lVar2 = *(long *)(this + 0x20) - lVar1;
      if (lVar2 != 0) {
        lVar2 = lVar2 >> 3;
        lVar3 = 0;
        do {
          it._M_current[lVar3] = *(unsigned_long *)(lVar1 + lVar3 * 8);
          lVar3 = lVar3 + 1;
        } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
Iterator<T, isConst, A>::coordinate
(
    CoordinateIterator it
) const
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index_ < view_->size());
    if(view_->isSimple()) {
        view_->indexToCoordinates(index_, it);
    }
    else {
        for(std::size_t j=0; j<coordinates_.size(); ++j, ++it) {
            *it = coordinates_[j];
        }
    }
}